

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O3

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,Vec2f *uvs,TGAImage *texture)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  TGAImage *this_00;
  bool bVar9;
  int iVar10;
  int iVar11;
  TGAColor TVar12;
  bool bVar13;
  bool bVar14;
  float *pfVar15;
  int iVar16;
  int i;
  long lVar17;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  TGAColor c;
  TGAColor local_c0 [2];
  float local_b4;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  TGAImage *local_78;
  Vec2f *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  float fStack_3c;
  
  local_78 = texture;
  local_70 = uvs;
  TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar10 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar11 = TGAImage::get_height(*(TGAImage **)(this + 8));
  local_98 = (float)(iVar10 + -1);
  _local_a8 = ZEXT416((uint)(float)(iVar11 + -1));
  lVar17 = 0;
  local_ac = 0.0;
  local_b0 = 0.0;
  fStack_90 = extraout_XMM0_Dc;
  fStack_8c = extraout_XMM0_Dd;
  iVar10 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar11 = TGAImage::get_height(*(TGAImage **)(this + 8));
  this_00 = local_78;
  do {
    bVar14 = false;
    fVar19 = local_98;
    bVar9 = true;
    do {
      bVar13 = bVar9;
      if (bVar14) {
        fVar18 = pts[lVar17].field_1.y;
        fVar20 = fVar18;
        if (SUB84(local_a8,0) <= fVar18) {
          fVar20 = SUB84(local_a8,0);
        }
        if (fVar20 <= 0.0) {
          fVar20 = 0.0;
        }
        local_a8 = (undefined1  [8])(ulong)(uint)fVar20;
        uStack_a0 = 0;
        pfVar15 = &local_b0;
        local_98 = fVar19;
        iVar16 = iVar11;
      }
      else {
        fVar18 = pts[lVar17].field_0.x;
        local_98 = fVar18;
        if (fVar19 <= fVar18) {
          local_98 = fVar19;
        }
        if (local_98 <= 0.0) {
          local_98 = 0.0;
        }
        fStack_90 = 0.0;
        fStack_8c = 0.0;
        pfVar15 = &local_ac;
        iVar16 = iVar10;
      }
      if (fVar18 <= *pfVar15) {
        fVar18 = *pfVar15;
      }
      if ((float)(iVar16 + -1) <= fVar18) {
        fVar18 = (float)(iVar16 + -1);
      }
      *pfVar15 = fVar18;
      fVar18 = local_b0;
      bVar14 = true;
      fVar19 = local_98;
      bVar9 = false;
    } while (bVar13);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_98 = (float)(int)(local_98 + 0.5);
  fStack_90 = (float)(int)fStack_90;
  fStack_8c = (float)(int)fStack_8c;
  if (local_98 <= local_ac) {
    uVar7 = (ulong)local_a8 >> 0x20;
    uVar8 = (ulong)uStack_a0 >> 0x20;
    local_a8._0_4_ = (undefined4)(int)(SUB84(local_a8,0) + 0.5);
    local_a8._4_4_ = (undefined4)(int)(float)uVar7;
    uStack_a0._0_4_ = (float)(int)(float)uStack_a0;
    uStack_a0._4_4_ = (float)(int)(float)uVar8;
    local_b4 = local_ac;
    local_68 = (float)local_a8._0_4_;
    fStack_64 = (float)local_a8._4_4_;
    fStack_60 = (float)uStack_a0;
    fStack_5c = uStack_a0._4_4_;
    do {
      for (; (float)local_a8._0_4_ <= fVar18; local_a8._0_4_ = (float)local_a8._0_4_ + 1.0) {
        uVar1 = pts->field_0;
        uVar4 = pts->field_1;
        uVar2 = pts[1].field_0;
        uVar5 = pts[1].field_1;
        uVar3 = pts[2].field_0;
        uVar6 = pts[2].field_1;
        fVar19 = ((float)uVar5 - (float)uVar4) * ((float)uVar3 - (float)uVar1) -
                 ((float)uVar6 - (float)uVar4) * ((float)uVar2 - (float)uVar1);
        local_48 = -1.0;
        local_58 = 1.0;
        fStack_84 = 0.0;
        local_88 = 1.0;
        if (0.01 < ABS(fVar19)) {
          local_58 = ((float)uVar1 - local_98) * ((float)uVar6 - (float)uVar4) -
                     ((float)uVar3 - (float)uVar1) * ((float)uVar4 - (float)local_a8._0_4_);
          fStack_84 = ((float)uVar4 - (float)local_a8._0_4_) * ((float)uVar2 - (float)uVar1) -
                      ((float)uVar1 - local_98) * ((float)uVar5 - (float)uVar4);
          local_48 = 1.0 - (fStack_84 + local_58) / fVar19;
          local_58 = local_58 / fVar19;
          local_88 = fStack_84 / fVar19;
        }
        if (((0.0 <= local_48) && (0.0 <= local_58)) && (0.0 <= local_88)) {
          fVar19 = pts[2].field_2.z * local_88 +
                   (pts->field_2).z * local_48 + pts[1].field_2.z * local_58;
          lVar17 = *(long *)(this + 0x10);
          uStack_40 = 0;
          fStack_94 = (float)local_a8._0_4_;
          fStack_80 = fStack_84;
          fStack_7c = fStack_84;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          fStack_44 = local_58;
          fStack_3c = fStack_84;
          iVar10 = TGAImage::get_width(*(TGAImage **)(this + 8));
          pfVar15 = (float *)(lVar17 + (long)(int)((float)iVar10 * (float)local_a8._0_4_ + local_98)
                                       * 4);
          if (fVar19 < *pfVar15 || fVar19 == *pfVar15) {
            lVar17 = *(long *)(this + 0x10);
            iVar10 = TGAImage::get_width(*(TGAImage **)(this + 8));
            *(float *)(lVar17 + (long)(int)((float)iVar10 * (float)local_a8._0_4_ + local_98) * 4) =
                 fVar19;
            fVar19 = (local_70->field_0).x * local_48;
            fVar20 = local_70[1].field_0.x * local_58;
            fVar21 = local_70[2].field_0.x * local_88;
            local_88 = local_88 * local_70[2].field_1.y +
                       local_58 * local_70[1].field_1.y + local_48 * (local_70->field_1).y;
            iVar10 = TGAImage::get_width(this_00);
            iVar11 = TGAImage::get_height(this_00);
            TVar12 = TGAImage::get(this_00,(int)((float)(iVar10 + -1) * (fVar21 + fVar20 + fVar19) +
                                                0.5),(int)((float)(iVar11 + -1) * local_88 + 0.5));
            local_c0[0].bgra = TVar12.bgra;
            local_c0[0].bytespp = TVar12.bytespp;
            TGAImage::set(*(TGAImage **)(this + 8),(int)local_98,(int)(float)local_a8._0_4_,local_c0
                         );
          }
        }
      }
      fVar19 = local_98 + 1.0;
      local_98 = local_98 + 1.0;
      local_a8._0_4_ = local_68;
      local_a8._4_4_ = fStack_64;
      uStack_a0._0_4_ = fStack_60;
      uStack_a0._4_4_ = fStack_5c;
    } while (fVar19 <= local_b4);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, Vec2f* uvs, TGAImage* texture) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = int(bboxmin.x + .5f); p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = int(bboxmin.y + .5f); p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;
      /**
       * Calculate texture color
       **/
      Vec2f uvf =
          uvs[0] * bc_screen[0] + uvs[1] * bc_screen[1] + uvs[2] * bc_screen[2];
      TGAColor c =
          texture->get(int((texture->get_width() - 1) * uvf[0] + .5f),
                       int((texture->get_height() - 1) * uvf[1] + .5f));
      mImage->set(p[0], p[1], c);
    }
  }
}